

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogUnixServer.cpp
# Opt level: O1

void __thiscall liblogger::LogUnixServer::Log(LogUnixServer *this,LogType Type,string *str)

{
  pointer pcVar1;
  long *******ppppppplVar2;
  uint uVar3;
  int iVar4;
  string *psVar5;
  size_t sVar6;
  ssize_t sVar7;
  int *piVar8;
  _List_node_base *p_Var9;
  char *pcVar10;
  LogException *this_00;
  long *******ppppppplVar11;
  long lVar12;
  _List_node_base *this_01;
  _List_node_base *p_Var13;
  long lVar14;
  char *msg;
  int fd;
  time_t current;
  list<int,_std::allocator<int>_> broken;
  tm timeinfo;
  char buf [128];
  char *local_2b8;
  pthread_mutex_t *local_2b0;
  _List_node_base *local_2a8;
  string local_2a0;
  time_t local_280;
  long *******local_278;
  long *******local_270;
  long local_268 [47];
  tm local_f0;
  char local_b8 [136];
  
  local_2b8 = (char *)0x0;
  local_280 = time((time_t *)0x0);
  localtime_r(&local_280,&local_f0);
  strftime(local_b8,0x80,"%F %T",&local_f0);
  psVar5 = LogTypeToStr_abi_cxx11_(Type);
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  uVar3 = getpid();
  iVar4 = asprintf(&local_2b8,"%s - %s [PID: %d] - %s\n",local_b8,pcVar1,(ulong)uVar3,
                   (str->_M_dataplus)._M_p);
  if (iVar4 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_268,"asprintf failed error:",0x16);
    piVar8 = __errno_location();
    pcVar10 = strerror(*piVar8);
    std::operator<<((ostream *)local_268,pcVar10);
    this_00 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(this_00,&local_2a0);
    __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
  }
  local_278 = (long *******)&local_278;
  local_268[0] = 0;
  local_270 = local_278;
  sVar6 = strlen(local_2b8);
  local_2b0 = (pthread_mutex_t *)&this->m_mutex;
  iVar4 = pthread_mutex_lock(local_2b0);
  if (iVar4 == 0) {
    p_Var13 = (this->m_list).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
              super__List_node_base._M_next;
    this_01 = (_List_node_base *)&this->m_list;
    if (p_Var13 != this_01) {
      lVar14 = (long)(int)sVar6;
      local_2a8 = this_01;
      do {
        iVar4 = *(int *)&p_Var13[1]._M_next;
        lVar12 = 0;
        do {
          sVar7 = write(iVar4,local_2b8 + lVar12,lVar14 - lVar12);
          if (sVar7 < 0) {
            piVar8 = __errno_location();
            if (*piVar8 == 4) {
              sVar7 = 0;
            }
          }
          else {
            lVar12 = lVar12 + lVar14;
          }
          this_01 = local_2a8;
        } while (lVar12 < lVar14);
        if (sVar7 < lVar14 || sVar7 == 0) {
          p_Var9 = (_List_node_base *)operator_new(0x18);
          *(int *)&p_Var9[1]._M_next = iVar4;
          std::__detail::_List_node_base::_M_hook(p_Var9);
          local_268[0] = local_268[0] + 1;
        }
        p_Var13 = p_Var13->_M_next;
      } while (p_Var13 != this_01);
    }
    if ((long ********)local_278 != &local_278) {
      ppppppplVar11 = local_278;
      do {
        local_2a0._M_dataplus._M_p._0_4_ = *(int *)(ppppppplVar11 + 2);
        iVar4 = close((int)local_2a0._M_dataplus._M_p);
        if (iVar4 < 0) goto LAB_00137bd0;
        std::__cxx11::list<int,_std::allocator<int>_>::remove
                  ((list<int,_std::allocator<int>_> *)this_01,(char *)&local_2a0);
        ppppppplVar11 = (long *******)*ppppppplVar11;
      } while ((long ********)ppppppplVar11 != &local_278);
    }
    iVar4 = pthread_mutex_unlock(local_2b0);
    ppppppplVar11 = local_278;
    if (iVar4 == 0) {
      while ((long ********)ppppppplVar11 != &local_278) {
        ppppppplVar2 = (long *******)*ppppppplVar11;
        operator_delete(ppppppplVar11,0x18);
        ppppppplVar11 = ppppppplVar2;
      }
      free(local_2b8);
      return;
    }
  }
LAB_00137bd0:
  abort();
}

Assistant:

void LogUnixServer::Log(const LogType Type, const std::string &str) {
	char *msg = NULL;

	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	strftime(buf, sizeof(buf), "%F %T", &timeinfo);

	if (asprintf(&msg, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "asprintf failed error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
	else
	{
		std::list<int> broken;
		int len = strlen(msg);

		Lock();

		for(auto fd : m_list)
		{
			ssize_t offset = 0;
			ssize_t ret = 0;
			do
			{
				ret = write(fd, msg + offset, len - offset);
				if (ret < 0)
				{
					switch(errno)
					{
						case EINTR:
							ret = 0; //Fudge this as if we didn't write anything
							break;
						default:
							break;
					}
				}
				else
				{
					offset += len;
				}
			} while(offset < len);

			if (ret < len || ret == 0)
			{
				broken.push_back(fd);
			}
		}

		//Kick any broken clients
		for(auto fd : broken)
		{
			if (close(fd) < 0)
			{
				abort();
			}
			m_list.remove(fd);
		}

		Unlock();

	}
	free(msg);
}